

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O2

QIODevice * __thiscall QNetworkAccessBackend::createUploadByteDevice(QNetworkAccessBackend *this)

{
  long lVar1;
  long lVar2;
  void **ppvVar3;
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined4 *puVar5;
  QIODevice *pQVar6;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff8c;
  QObject local_58 [8];
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0xa0);
  if (*(long *)(lVar2 + 0x240) == 0) {
    if (*(long *)(lVar2 + 0x238) == 0) {
      pQVar6 = (QIODevice *)0x0;
      goto LAB_00171635;
    }
    QNonContiguousByteDeviceFactory::createShared((QIODevice *)&local_40);
    std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x88),
               (__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
    p_Var4 = &local_40;
  }
  else {
    std::__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x240));
    QNonContiguousByteDeviceFactory::createShared(&local_40,&local_50);
    std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 0x88),
               (__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    p_Var4 = &local_50;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var4->_M_refcount);
  if (*(char *)(*(long *)(this + 8) + 0xb1) == '\0') {
    ppvVar3 = *(void ***)(lVar1 + 0x88);
    local_40._M_ptr = (element_type *)QNonContiguousByteDevice::readProgress;
    local_40._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessbackend.cpp:682:17),_QtPrivate::List<long_long,_long_long>,_void>
         ::impl;
    *(QNetworkAccessBackend **)(puVar5 + 4) = this;
    QObject::connectImpl
              (local_58,ppvVar3,(QObject *)&local_40,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar5,(int *)((ulong)in_stack_ffffffffffffff8c << 0x20),
               (QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
  }
  pQVar6 = (QIODevice *)
           QNonContiguousByteDeviceFactory::wrap(*(QNonContiguousByteDevice **)(lVar1 + 0x88));
  *(QIODevice **)(lVar1 + 0x98) = pQVar6;
LAB_00171635:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QIODevice *QNetworkAccessBackend::createUploadByteDevice()
{
    Q_D(QNetworkAccessBackend);

    if (d->m_reply->outgoingDataBuffer)
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingDataBuffer);
    else if (d->m_reply->outgoingData) {
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!isSynchronous()) {
        connect(d->uploadByteDevice.get(), &QNonContiguousByteDevice::readProgress, this,
                [this](qint64 a, qint64 b) {
                    Q_D(QNetworkAccessBackend);
                    if (!d->m_reply->isFinished)
                        d->m_reply->emitUploadProgress(a, b);
                });
    }

    d->wrappedUploadByteDevice = QNonContiguousByteDeviceFactory::wrap(d->uploadByteDevice.get());
    return d->wrappedUploadByteDevice;
}